

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetImportedXcFrameworkPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  cmValue loc;
  string suffix;
  string desiredConfig;
  string impProp;
  cmValue imp;
  allocator<char> local_c9;
  string local_c8;
  cmValue local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  cmValue local_20;
  
  bVar1 = IsApple(this);
  if (((!bVar1) || (bVar1 = IsImported(this), !bVar1)) ||
     ((TVar2 = GetType(this), TVar2 != SHARED_LIBRARY &&
      ((TVar2 = GetType(this), TVar2 != STATIC_LIBRARY &&
       (TVar2 = GetType(this), TVar2 != UNKNOWN_LIBRARY)))))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_80,(string *)config);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_80);
  }
  paVar5 = &local_c8.field_2;
  local_c8._M_string_length = 0;
  local_a8.Value = (string *)0x0;
  local_20.Value = (string *)0x0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar5;
  bVar1 = cmTarget::GetMappedConfig(this->Target,&local_80,&local_a8,&local_20,&local_a0);
  if (bVar1) {
    if (local_a8.Value == (string *)0x0) {
      cmStrCat<char_const(&)[18],std::__cxx11::string&>
                (&local_40,(char (*) [18])"IMPORTED_LOCATION",&local_a0);
      cVar3 = GetProperty(this,&local_40);
      if (cVar3.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"IMPORTED_LOCATION",&local_c9);
        cVar3 = GetProperty(this,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        if (cVar3.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_c8);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_c8);
    }
    bVar1 = cmSystemTools::IsPathToXcFramework(&local_c8);
    if (bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == paVar5) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_c8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0])
        ;
      }
      psVar4 = &local_c8._M_string_length;
      __return_storage_ptr__->_M_string_length = local_c8._M_string_length;
      local_c8._M_dataplus._M_p = (pointer)paVar5;
      goto LAB_004a2ab5;
    }
  }
  paVar5 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
  psVar4 = &__return_storage_ptr__->_M_string_length;
LAB_004a2ab5:
  *psVar4 = 0;
  paVar5->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetImportedXcFrameworkPath(
  const std::string& config) const
{
  if (!(this->IsApple() && this->IsImported() &&
        (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
         this->GetType() == cmStateEnums::STATIC_LIBRARY ||
         this->GetType() == cmStateEnums::UNKNOWN_LIBRARY))) {
    return {};
  }

  std::string desiredConfig = config;
  if (config.empty()) {
    desiredConfig = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->Target->GetMappedConfig(desiredConfig, loc, imp, suffix)) {
    if (loc) {
      result = *loc;
    } else {
      std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
      if (cmValue configLocation = this->GetProperty(impProp)) {
        result = *configLocation;
      } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
        result = *location;
      }
    }

    if (cmSystemTools::IsPathToXcFramework(result)) {
      return result;
    }
  }

  return {};
}